

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SwapOneofField<false>
          (Reflection *this,Message *lhs,Message *rhs,OneofDescriptor *oneof_descriptor)

{
  bool bVar1;
  uint32_t key;
  uint32_t uVar2;
  CppType CVar3;
  uint32_t uVar4;
  int32_t v;
  int v_00;
  LogMessage *pLVar5;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  Message *v_01;
  uint64_t v_02;
  int64_t v_03;
  float fVar6;
  double v_04;
  LogFinisher local_d1;
  MessageWrapper local_d0;
  MessageWrapper local_b8;
  LocalVarWrapper temp;
  LogMessage local_70;
  LogMessage *local_38;
  
  if ((*(int *)(oneof_descriptor + 4) == 1) &&
     ((*(byte *)(*(long *)(oneof_descriptor + 0x20) + 1) & 2) != 0)) {
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x36f);
    pLVar5 = internal::LogMessage::operator<<
                       (&local_70,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
    internal::LogFinisher::operator=((LogFinisher *)&temp,pLVar5);
    internal::LogMessage::~LogMessage(&local_70);
  }
  key = GetOneofCase(this,lhs,oneof_descriptor);
  uVar2 = GetOneofCase(this,rhs,oneof_descriptor);
  temp.string_val._M_dataplus._M_p = (pointer)&temp.string_val.field_2;
  temp.string_val._M_string_length = 0;
  temp.string_val.field_2._M_local_buf[0] = '\0';
  if (key == 0) {
    this_00 = (FieldDescriptor *)0x0;
    goto LAB_0039cde0;
  }
  this_00 = Descriptor::FindFieldByNumber(this->descriptor_,key);
  local_b8.reflection = this;
  local_b8.message = lhs;
  local_b8.field = this_00;
  CVar3 = FieldDescriptor::cpp_type(this_00);
  switch(CVar3) {
  case CPPTYPE_INT32:
    uVar4 = SwapOneofField<false>::MessageWrapper::GetInt32(&local_b8);
    goto LAB_0039cd11;
  case CPPTYPE_INT64:
    temp.oneof_val.type_int64 = SwapOneofField<false>::MessageWrapper::GetInt64(&local_b8);
    break;
  case CPPTYPE_UINT32:
    uVar4 = SwapOneofField<false>::MessageWrapper::GetUint32(&local_b8);
    goto LAB_0039cd11;
  case CPPTYPE_UINT64:
    temp.oneof_val.type_uint64 = SwapOneofField<false>::MessageWrapper::GetUint64(&local_b8);
    break;
  case CPPTYPE_DOUBLE:
    temp.oneof_val.type_double = SwapOneofField<false>::MessageWrapper::GetDouble(&local_b8);
    break;
  case CPPTYPE_FLOAT:
    fVar6 = SwapOneofField<false>::MessageWrapper::GetFloat(&local_b8);
    temp.oneof_val.type_float = fVar6;
    break;
  case CPPTYPE_BOOL:
    bVar1 = SwapOneofField<false>::MessageWrapper::GetBool(&local_b8);
    temp.oneof_val.type_bool = bVar1;
    break;
  case CPPTYPE_ENUM:
    uVar4 = SwapOneofField<false>::MessageWrapper::GetEnum(&local_b8);
LAB_0039cd11:
    temp.oneof_val.type_enum = uVar4;
    break;
  case CPPTYPE_STRING:
    SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
    ::GetString_abi_cxx11_((string *)&local_70,&local_b8);
    std::__cxx11::string::_M_assign((string *)&temp.string_val);
    std::__cxx11::string::~string((string *)&local_70);
    break;
  case CPPTYPE_MESSAGE:
    temp.oneof_val.type_message = SwapOneofField<false>::MessageWrapper::GetMessage(&local_b8);
    break;
  default:
    internal::LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x1bf);
    local_38 = internal::LogMessage::operator<<(&local_70,"unimplemented type: ");
    CVar3 = FieldDescriptor::cpp_type(this_00);
    pLVar5 = internal::LogMessage::operator<<(local_38,CVar3);
    internal::LogFinisher::operator=(&local_d1,pLVar5);
    internal::LogMessage::~LogMessage(&local_70);
  }
LAB_0039cde0:
  if (uVar2 == 0) {
    ClearOneof(this,lhs,oneof_descriptor);
  }
  else {
    this_01 = Descriptor::FindFieldByNumber(this->descriptor_,uVar2);
    local_d0.reflection = this;
    local_d0.message = rhs;
    local_d0.field = this_01;
    local_b8.reflection = this;
    local_b8.message = lhs;
    local_b8.field = this_01;
    CVar3 = FieldDescriptor::cpp_type(this_01);
    switch(CVar3) {
    case CPPTYPE_INT32:
      v = SwapOneofField<false>::MessageWrapper::GetInt32(&local_d0);
      SwapOneofField<false>::MessageWrapper::SetInt32(&local_b8,v);
      break;
    case CPPTYPE_INT64:
      v_03 = SwapOneofField<false>::MessageWrapper::GetInt64(&local_d0);
      SwapOneofField<false>::MessageWrapper::SetInt64(&local_b8,v_03);
      break;
    case CPPTYPE_UINT32:
      uVar2 = SwapOneofField<false>::MessageWrapper::GetUint32(&local_d0);
      SwapOneofField<false>::MessageWrapper::SetUint32(&local_b8,uVar2);
      break;
    case CPPTYPE_UINT64:
      v_02 = SwapOneofField<false>::MessageWrapper::GetUint64(&local_d0);
      SwapOneofField<false>::MessageWrapper::SetUint64(&local_b8,v_02);
      break;
    case CPPTYPE_DOUBLE:
      v_04 = SwapOneofField<false>::MessageWrapper::GetDouble(&local_d0);
      SwapOneofField<false>::MessageWrapper::SetDouble(&local_b8,v_04);
      break;
    case CPPTYPE_FLOAT:
      fVar6 = SwapOneofField<false>::MessageWrapper::GetFloat(&local_d0);
      SwapOneofField<false>::MessageWrapper::SetFloat(&local_b8,fVar6);
      break;
    case CPPTYPE_BOOL:
      bVar1 = SwapOneofField<false>::MessageWrapper::GetBool(&local_d0);
      SwapOneofField<false>::MessageWrapper::SetBool(&local_b8,bVar1);
      break;
    case CPPTYPE_ENUM:
      v_00 = SwapOneofField<false>::MessageWrapper::GetEnum(&local_d0);
      SwapOneofField<false>::MessageWrapper::SetEnum(&local_b8,v_00);
      break;
    case CPPTYPE_STRING:
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::GetString_abi_cxx11_((string *)&local_70,&local_d0);
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_b8,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      break;
    case CPPTYPE_MESSAGE:
      v_01 = SwapOneofField<false>::MessageWrapper::GetMessage(&local_d0);
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::Message__(&local_b8,v_01);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar5 = internal::LogMessage::operator<<(&local_70,"unimplemented type: ");
      CVar3 = FieldDescriptor::cpp_type(this_01);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,CVar3);
      internal::LogFinisher::operator=(&local_d1,pLVar5);
      internal::LogMessage::~LogMessage(&local_70);
    }
  }
  if (key == 0) {
    ClearOneof(this,rhs,oneof_descriptor);
  }
  else {
    local_d0.reflection = this;
    local_d0.message = rhs;
    local_d0.field = this_00;
    CVar3 = FieldDescriptor::cpp_type(this_00);
    switch(CVar3) {
    case CPPTYPE_INT32:
      SwapOneofField<false>::MessageWrapper::SetInt32(&local_d0,temp.oneof_val.type_int32);
      break;
    case CPPTYPE_INT64:
      SwapOneofField<false>::MessageWrapper::SetInt64(&local_d0,temp.oneof_val.type_int64);
      break;
    case CPPTYPE_UINT32:
      SwapOneofField<false>::MessageWrapper::SetUint32(&local_d0,temp.oneof_val.type_uint32);
      break;
    case CPPTYPE_UINT64:
      SwapOneofField<false>::MessageWrapper::SetUint64(&local_d0,temp.oneof_val.type_uint64);
      break;
    case CPPTYPE_DOUBLE:
      SwapOneofField<false>::MessageWrapper::SetDouble(&local_d0,temp.oneof_val.type_double);
      break;
    case CPPTYPE_FLOAT:
      SwapOneofField<false>::MessageWrapper::SetFloat(&local_d0,temp.oneof_val.type_float);
      break;
    case CPPTYPE_BOOL:
      SwapOneofField<false>::MessageWrapper::SetBool(&local_d0,temp.oneof_val.type_bool);
      break;
    case CPPTYPE_ENUM:
      SwapOneofField<false>::MessageWrapper::SetEnum(&local_d0,temp.oneof_val.type_enum);
      break;
    case CPPTYPE_STRING:
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::string_const__(&local_d0,&temp.string_val);
      break;
    case CPPTYPE_MESSAGE:
      SwapOneofField<false>(google::protobuf::Message*,google::protobuf::Message*,google::protobuf::OneofDescriptor_const*)
      ::Message__(&local_d0,temp.oneof_val.type_message);
      break;
    default:
      internal::LogMessage::LogMessage
                (&local_70,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                 ,0x1bf);
      pLVar5 = internal::LogMessage::operator<<(&local_70,"unimplemented type: ");
      CVar3 = FieldDescriptor::cpp_type(this_00);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,CVar3);
      internal::LogFinisher::operator=(&local_d1,pLVar5);
      internal::LogMessage::~LogMessage(&local_70);
    }
  }
  std::__cxx11::string::~string((string *)&temp.string_val);
  return;
}

Assistant:

void Reflection::SwapOneofField(Message* lhs, Message* rhs,
                                const OneofDescriptor* oneof_descriptor) const {
  // Wraps a local variable to temporarily store oneof value.
  struct LocalVarWrapper {
#define LOCAL_VAR_ACCESSOR(type, var, name)               \
  type Get##name() const { return oneof_val.type_##var; } \
  void Set##name(type v) { oneof_val.type_##var = v; }

    LOCAL_VAR_ACCESSOR(int32_t, int32, Int32);
    LOCAL_VAR_ACCESSOR(int64_t, int64, Int64);
    LOCAL_VAR_ACCESSOR(uint32_t, uint32, Uint32);
    LOCAL_VAR_ACCESSOR(uint64_t, uint64, Uint64);
    LOCAL_VAR_ACCESSOR(float, float, Float);
    LOCAL_VAR_ACCESSOR(double, double, Double);
    LOCAL_VAR_ACCESSOR(bool, bool, Bool);
    LOCAL_VAR_ACCESSOR(int, enum, Enum);
    LOCAL_VAR_ACCESSOR(Message*, message, Message);
    LOCAL_VAR_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    const std::string& GetString() const { return string_val; }
    void SetString(const std::string& v) { string_val = v; }
    Message* UnsafeGetMessage() const { return GetMessage(); }
    void UnsafeSetMessage(Message* v) { SetMessage(v); }
    void ClearOneofCase() {}

    union {
      int32_t type_int32;
      int64_t type_int64;
      uint32_t type_uint32;
      uint64_t type_uint64;
      float type_float;
      double type_double;
      bool type_bool;
      int type_enum;
      Message* type_message;
      internal::ArenaStringPtr type_arena_string_ptr;
    } oneof_val;

    // std::string cannot be in union.
    std::string string_val;
  };

  // Wraps a message pointer to read and write a field.
  struct MessageWrapper {
#define MESSAGE_FIELD_ACCESSOR(type, var, name)         \
  type Get##name() const {                              \
    return reflection->GetField<type>(*message, field); \
  }                                                     \
  void Set##name(type v) { reflection->SetField<type>(message, field, v); }

    MESSAGE_FIELD_ACCESSOR(int32_t, int32, Int32);
    MESSAGE_FIELD_ACCESSOR(int64_t, int64, Int64);
    MESSAGE_FIELD_ACCESSOR(uint32_t, uint32, Uint32);
    MESSAGE_FIELD_ACCESSOR(uint64_t, uint64, Uint64);
    MESSAGE_FIELD_ACCESSOR(float, float, Float);
    MESSAGE_FIELD_ACCESSOR(double, double, Double);
    MESSAGE_FIELD_ACCESSOR(bool, bool, Bool);
    MESSAGE_FIELD_ACCESSOR(int, enum, Enum);
    MESSAGE_FIELD_ACCESSOR(ArenaStringPtr, arena_string_ptr, ArenaStringPtr);
    std::string GetString() const {
      return reflection->GetString(*message, field);
    }
    void SetString(const std::string& v) {
      reflection->SetString(message, field, v);
    }
    Message* GetMessage() const {
      return reflection->ReleaseMessage(message, field);
    }
    void SetMessage(Message* v) {
      reflection->SetAllocatedMessage(message, v, field);
    }
    Message* UnsafeGetMessage() const {
      return reflection->UnsafeArenaReleaseMessage(message, field);
    }
    void UnsafeSetMessage(Message* v) {
      reflection->UnsafeArenaSetAllocatedMessage(message, v, field);
    }
    void ClearOneofCase() {
      *reflection->MutableOneofCase(message, field->containing_oneof()) = 0;
    }

    const Reflection* reflection;
    Message* message;
    const FieldDescriptor* field;
  };

  GOOGLE_DCHECK(!oneof_descriptor->is_synthetic());
  uint32 oneof_case_lhs = GetOneofCase(*lhs, oneof_descriptor);
  uint32 oneof_case_rhs = GetOneofCase(*rhs, oneof_descriptor);

  LocalVarWrapper temp;
  MessageWrapper lhs_wrapper, rhs_wrapper;
  const FieldDescriptor* field_lhs = nullptr;
  OneofFieldMover<unsafe_shallow_swap> mover;
  // lhs --> temp
  if (oneof_case_lhs > 0) {
    field_lhs = descriptor_->FindFieldByNumber(oneof_case_lhs);
    lhs_wrapper = {this, lhs, field_lhs};
    mover(field_lhs, &lhs_wrapper, &temp);
  }
  // rhs --> lhs
  if (oneof_case_rhs > 0) {
    const FieldDescriptor* f = descriptor_->FindFieldByNumber(oneof_case_rhs);
    lhs_wrapper = {this, lhs, f};
    rhs_wrapper = {this, rhs, f};
    mover(f, &rhs_wrapper, &lhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(lhs, oneof_descriptor);
  }
  // temp --> rhs
  if (oneof_case_lhs > 0) {
    rhs_wrapper = {this, rhs, field_lhs};
    mover(field_lhs, &temp, &rhs_wrapper);
  } else if (!unsafe_shallow_swap) {
    ClearOneof(rhs, oneof_descriptor);
  }

  if (unsafe_shallow_swap) {
    *MutableOneofCase(lhs, oneof_descriptor) = oneof_case_rhs;
    *MutableOneofCase(rhs, oneof_descriptor) = oneof_case_lhs;
  }
}